

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O3

bool __thiscall
cube::net::TcpConnection::Write(TcpConnection *this,char *data,size_t len,WriteCompleteCallback *cb)

{
  ConnState CVar1;
  Eventor *this_00;
  EventLoop *pEVar2;
  uint uVar3;
  ssize_t sVar4;
  _Any_data local_90;
  code *local_80;
  undefined8 local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_68;
  _Any_data local_60;
  code *local_50;
  undefined8 local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  
  CVar1 = this->m_state;
  if (CVar1 == ConnState_Disconnected) {
    strings::FormatString(&this->m_err_msg,"tcp connection[%lu] is closed",this->m_conn_id);
    goto LAB_0011fd2d;
  }
  if (len == 0) {
    if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0011fd2d;
    pEVar2 = this->m_event_loop;
    std::__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cube::net::TcpConnection,void>
              ((__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__weak_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>::function
              ((function<void_(std::shared_ptr<cube::net::TcpConnection>)> *)&local_90,cb);
    local_70 = local_40;
    p_Stack_68 = p_Stack_38;
    local_40 = 0;
    p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::function<void()>::
    function<std::_Bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>)>(std::shared_ptr<cube::net::TcpConnection>)>,void>
              ((function<void()> *)local_60._M_pod_data,
               (_Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>_(std::shared_ptr<cube::net::TcpConnection>)>
                *)&local_90);
    EventLoop::Post(pEVar2,(Task *)&local_60);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    if (p_Stack_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_68);
    }
    if (local_80 != (code *)0x0) {
      (*local_80)(&local_90,&local_90,__destroy_functor);
    }
LAB_0011fdd3:
    if (p_Stack_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_38);
    }
  }
  else {
    if ((CVar1 == ConnState_Connected) &&
       ((this->m_output_buffer).write_index == (this->m_output_buffer).read_index)) {
      sVar4 = write(((this->m_eventor)._M_t.
                     super___uniq_ptr_impl<cube::net::Eventor,_std::default_delete<cube::net::Eventor>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cube::net::Eventor_*,_std::default_delete<cube::net::Eventor>_>
                     .super__Head_base<0UL,_cube::net::Eventor_*,_false>._M_head_impl)->m_fd,data,
                    len);
      uVar3 = (uint)sVar4;
      if (-1 < (int)uVar3) {
        if ((int)len <= (int)uVar3) {
          if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0011fd2d;
          pEVar2 = this->m_event_loop;
          std::__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<cube::net::TcpConnection,void>
                    ((__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                     (__weak_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
          std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>::function
                    ((function<void_(std::shared_ptr<cube::net::TcpConnection>)> *)&local_90,cb);
          local_70 = local_40;
          p_Stack_68 = p_Stack_38;
          local_40 = 0;
          p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::function<void()>::
          function<std::_Bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>)>(std::shared_ptr<cube::net::TcpConnection>)>,void>
                    ((function<void()> *)local_60._M_pod_data,
                     (_Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>_(std::shared_ptr<cube::net::TcpConnection>)>
                      *)&local_90);
          EventLoop::Post(pEVar2,(Task *)&local_60);
          if (local_50 != (code *)0x0) {
            (*local_50)(&local_60,&local_60,__destroy_functor);
          }
          std::
          _Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>_(std::shared_ptr<cube::net::TcpConnection>)>
          ::~_Bind((_Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>_(std::shared_ptr<cube::net::TcpConnection>)>
                    *)&local_90);
          goto LAB_0011fdd3;
        }
        data = data + (uVar3 & 0x7fffffff);
        len = len - (uVar3 & 0x7fffffff);
      }
    }
    std::function<void_(std::shared_ptr<cube::net::TcpConnection>)>::operator=
              (&this->m_write_complete_callback,cb);
    Buffer::Append(&this->m_output_buffer,data,len);
    this_00 = (this->m_eventor)._M_t.
              super___uniq_ptr_impl<cube::net::Eventor,_std::default_delete<cube::net::Eventor>_>.
              _M_t.
              super__Tuple_impl<0UL,_cube::net::Eventor_*,_std::default_delete<cube::net::Eventor>_>
              .super__Head_base<0UL,_cube::net::Eventor_*,_false>._M_head_impl;
    if ((this_00->m_events & 4) == 0) {
      this_00->m_events = this_00->m_events | 4;
      Eventor::Update(this_00);
    }
  }
LAB_0011fd2d:
  return CVar1 != ConnState_Disconnected;
}

Assistant:

bool TcpConnection::Write(const char *data, size_t len, const WriteCompleteCallback &cb) {
    // Not allow to send data when closed
    if (Closed()) {
        strings::FormatString(m_err_msg, "tcp connection[%lu] is closed", Id());
        return false;
    }

    if (len == 0) {
        // It is always ok to send 0-length data
        if (cb) {
            m_event_loop->Post(std::bind(cb, shared_from_this()));
        }
        return true;
    }

    // send data directly when no pending data to send
    if (m_state == ConnState_Connected && m_output_buffer.ReadableBytes() == 0) {
        int nwrote = ::write(m_eventor->Fd(), data, len);
        if (nwrote < 0) {
            // send data directly failed
            // write data to output buffer and wait for POLLIN event
        } else if (nwrote >= static_cast<int>(len)) {
            // send all data directly
            if (cb)
                m_event_loop->Post(std::bind(cb, shared_from_this()));
            return true;
        } else {
            // send some data directly but not all,
            // write the rest to output buffer
            data += nwrote;
            len -= nwrote;
        }
    }

    m_write_complete_callback = cb;
    //SetWriteCompleteCallback(cb);
    m_output_buffer.Append(data, len);
    if (!m_eventor->Writing())
        m_eventor->EnableWriting();
    return true;
}